

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeCompareMemString(Mem *pMem1,Mem *pMem2,CollSeq *pColl,u8 *prcErr)

{
  void *pvVar1;
  void *pvVar2;
  undefined1 local_b8 [8];
  Mem c2;
  Mem c1;
  void *v2;
  void *v1;
  int rc;
  u8 *prcErr_local;
  CollSeq *pColl_local;
  Mem *pMem2_local;
  Mem *pMem1_local;
  
  if (pMem1->enc == pColl->enc) {
    pMem1_local._4_4_ = (*pColl->xCmp)(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }
  else {
    sqlite3VdbeMemInit((Mem *)&c2.xDel,pMem1->db,1);
    sqlite3VdbeMemInit((Mem *)local_b8,pMem1->db,1);
    sqlite3VdbeMemShallowCopy((Mem *)&c2.xDel,pMem1,0x4000);
    sqlite3VdbeMemShallowCopy((Mem *)local_b8,pMem2,0x4000);
    pvVar1 = sqlite3ValueText((sqlite3_value *)&c2.xDel,pColl->enc);
    pvVar2 = sqlite3ValueText((sqlite3_value *)local_b8,pColl->enc);
    if ((pvVar1 == (void *)0x0) || (pvVar2 == (void *)0x0)) {
      if (prcErr != (u8 *)0x0) {
        *prcErr = '\a';
      }
      v1._4_4_ = 0;
    }
    else {
      v1._4_4_ = (*pColl->xCmp)(pColl->pUser,(int)c1.z,pvVar1,(int)c2.z,pvVar2);
    }
    sqlite3VdbeMemReleaseMalloc((Mem *)&c2.xDel);
    sqlite3VdbeMemReleaseMalloc((Mem *)local_b8);
    pMem1_local._4_4_ = v1._4_4_;
  }
  return pMem1_local._4_4_;
}

Assistant:

static int vdbeCompareMemString(
  const Mem *pMem1,
  const Mem *pMem2,
  const CollSeq *pColl,
  u8 *prcErr                      /* If an OOM occurs, set to SQLITE_NOMEM */
){
  if( pMem1->enc==pColl->enc ){
    /* The strings are already in the correct encoding.  Call the
     ** comparison function directly */
    return pColl->xCmp(pColl->pUser,pMem1->n,pMem1->z,pMem2->n,pMem2->z);
  }else{
    int rc;
    const void *v1, *v2;
    Mem c1;
    Mem c2;
    sqlite3VdbeMemInit(&c1, pMem1->db, MEM_Null);
    sqlite3VdbeMemInit(&c2, pMem1->db, MEM_Null);
    sqlite3VdbeMemShallowCopy(&c1, pMem1, MEM_Ephem);
    sqlite3VdbeMemShallowCopy(&c2, pMem2, MEM_Ephem);
    v1 = sqlite3ValueText((sqlite3_value*)&c1, pColl->enc);
    v2 = sqlite3ValueText((sqlite3_value*)&c2, pColl->enc);
    if( (v1==0 || v2==0) ){
      if( prcErr ) *prcErr = SQLITE_NOMEM_BKPT;
      rc = 0;
    }else{
      rc = pColl->xCmp(pColl->pUser, c1.n, v1, c2.n, v2);
    }
    sqlite3VdbeMemReleaseMalloc(&c1);
    sqlite3VdbeMemReleaseMalloc(&c2);
    return rc;
  }
}